

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warrior.c
# Opt level: O3

void do_overhead(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  short sVar2;
  undefined2 uVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  CHAR_DATA *victim;
  OBJ_DATA *pOVar10;
  ulong uVar11;
  char *pcVar12;
  short sVar13;
  char *pcVar14;
  float fVar15;
  AFFECT_DATA af;
  char buf [4608];
  char arg [4608];
  
  one_argument(argument,arg);
  iVar5 = get_skill(ch,(int)gsn_overhead);
  if (iVar5 == 0) {
    pcVar14 = "Huh?\n\r";
LAB_0032d704:
    send_to_char(pcVar14,ch);
    return;
  }
  if (*argument == '\0') {
    victim = ch->fighting;
    if (victim == (CHAR_DATA *)0x0) {
      pcVar14 = "Overhead who?\n\r";
      goto LAB_0032d704;
    }
  }
  else {
    victim = get_char_room(ch,argument);
    if (victim == (CHAR_DATA *)0x0) {
      pcVar14 = "They aren\'t here.\n\r";
      goto LAB_0032d704;
    }
  }
  if (victim == ch) {
    pcVar14 = "You aren\'t too bright, are you?\n\r";
    goto LAB_0032d704;
  }
  pOVar10 = get_eq_char(ch,0x10);
  if (pOVar10 == (OBJ_DATA *)0x0) {
    pcVar14 = "You need to be wielding a weapon for that maneuver!\n\r";
    goto LAB_0032d704;
  }
  if (pOVar10->weight < 0xf) {
    pcVar14 = "Your weapon is too light for you to execute that maneuver.\n\r";
    goto LAB_0032d704;
  }
  bVar4 = is_safe(ch,victim);
  if (bVar4) {
    return;
  }
  if (ch->size + 1 < (int)victim->size) {
    pcVar14 = "They are too large for you to properly perform an overhead strike.\n\r";
    goto LAB_0032d704;
  }
  if ((ch->fighting == (CHAR_DATA *)0x0) && (bVar4 = is_affected(victim,(int)gsn_overhead), bVar4))
  {
    pcVar14 = "They are guarding their head too well right now.\n\r";
    goto LAB_0032d704;
  }
  uVar6 = pOVar10->value[0] - 1;
  if ((8 < uVar6) || ((0x139U >> (uVar6 & 0x1f) & 1) == 0)) {
    pcVar14 = "You cannot perform an overhead strike with that weapon.\n\r";
    goto LAB_0032d704;
  }
  uVar11 = (ulong)uVar6;
  iVar7 = *(int *)(&DAT_003d4e08 + uVar11 * 4);
  iVar8 = *(int *)(&DAT_003d4e2c + uVar11 * 4);
  act(&DAT_003d4de4 + *(int *)(&DAT_003d4de4 + uVar11 * 4),ch,(void *)0x0,victim,3);
  act(&DAT_003d4e08 + iVar7,ch,(void *)0x0,victim,2);
  act(&DAT_003d4e2c + iVar8,ch,(void *)0x0,victim,1);
  sVar13 = ch->size;
  sVar1 = victim->size;
  sVar2 = pOVar10->weight;
  iVar7 = number_percent();
  if ((double)iVar5 * 0.7 <= (double)iVar7) {
    damage(ch,victim,0,(int)gsn_overhead,0,true);
    goto LAB_0032dcd3;
  }
  fVar15 = ((float)(int)sVar2 / 200.0 + 1.0) *
           ((float)((int)sVar13 - (int)sVar1) * 0.25 + 1.0) * (float)iVar5;
  if ((ch->fighting == (CHAR_DATA *)0x0) && (iVar8 = number_percent(), (float)iVar8 < fVar15 * 0.3))
  {
    init_affect(&af);
    af.where = 0;
    af.duration = 2;
    af.bitvector[0]._2_1_ = af.bitvector[0]._2_1_ | 2;
    af.type = gsn_overhead;
    af.level = ch->level;
    af.aftype = 3;
    af.location = 0;
    af.modifier = 0;
    af.mod_name = 7;
    iVar8 = pOVar10->value[0];
    if (iVar8 == 9) {
      act("$N collapses in a heap as your staff comes down solidly on top of $S head!",ch,
          (void *)0x0,victim,3);
      act("The world goes black as $n\'s staff crashes into your head.",ch,(void *)0x0,victim,2);
      pcVar14 = "$N collapses in a heap as the staff comes down solidly on top of $S head!";
    }
    else if (iVar8 == 6) {
      act("$N collapses in a heap as your flail comes down solidly on top of $S head!",ch,
          (void *)0x0,victim,3);
      act("The world goes black as $n\'s flail crashes into your head.",ch,(void *)0x0,victim,2);
      pcVar14 = "$N collapses in a heap as the flail comes down solidly on top of $S head!";
    }
    else {
      if (iVar8 != 4) goto LAB_0032d9b6;
      act("$N collapses in a heap as your mace comes down solidly on top of $S head!",ch,(void *)0x0
          ,victim,3);
      act("The world goes black as $n\'s mace crashes into your head.",ch,(void *)0x0,victim,2);
      pcVar14 = "$N collapses in a heap as the mace comes down solidly on top of $S head!";
    }
    act(pcVar14,ch,(void *)0x0,victim,1);
    affect_to_char(victim,&af);
    stop_fighting(victim,true);
    victim->position = 4;
    bVar4 = true;
    goto LAB_0032dcec;
  }
LAB_0032d9b6:
  iVar9 = number_percent();
  iVar8 = 100;
  if (fVar15 * 0.5 <= (float)iVar9) goto switchD_0032da5d_caseD_2;
  init_affect(&af);
  af.where = 0;
  af.type = gsn_bleeding;
  af.location = 0;
  af.modifier = 0;
  af.aftype = 5;
  af.tick_fun = bleeding_tick;
  af.end_fun = (AFF_FUN *)0x0;
  af.level = ch->level;
  af.owner = ch;
  switch(pOVar10->value[0]) {
  case 1:
    act("Your massive blade cleaves deeply into $N\'s flesh, striking bone!",ch,(void *)0x0,victim,3
       );
    act("$n\'s massive blade cleaves deeply into your flesh, striking bone!",ch,(void *)0x0,victim,2
       );
    act("The massive blade cleaves deeply into $N\'s flesh, striking bone!",ch,(void *)0x0,victim,1)
    ;
    af.duration = ch->level / 0xc;
    bVar4 = is_affected(victim,(int)gsn_bleeding);
    iVar8 = 200;
    goto LAB_0032db56;
  default:
    goto switchD_0032da5d_caseD_2;
  case 4:
    act("$N staggers and looks stunned as your mace crashes into $S head!",ch,(void *)0x0,victim,3);
    act("You stagger in a daze as $n\'s mace crashes into your head!",ch,(void *)0x0,victim,2);
    pcVar14 = "$N staggers and looks stunned as the mace crashes into $S head!";
    break;
  case 5:
    act("$N is enshrouded in a fine mist of blood as your mighty blow strikes true!",ch,(void *)0x0,
        victim,3);
    act("You are enshrouded in a fine mist of blood as $n\'s axe strikes true!",ch,(void *)0x0,
        victim,2);
    act("$N is enshrouded in a fine mist of blood as the mighty blow strikes true!",ch,(void *)0x0,
        victim,1);
    uVar3 = ch->level;
    sVar13 = uVar3 + 7;
    if (-1 < (short)uVar3) {
      sVar13 = uVar3;
    }
    af.duration = (short)((uint)(int)sVar13 >> 3);
    bVar4 = is_affected(victim,(int)gsn_bleeding);
    iVar8 = 100;
LAB_0032db56:
    if (bVar4 == false) {
      new_affect_to_char(victim,&af);
    }
    goto switchD_0032da5d_caseD_2;
  case 6:
    act("$N staggers and looks stunned as your flail crashes into $S head!",ch,(void *)0x0,victim,3)
    ;
    act("You stagger in a daze as $n\'s flail crashes into your head!",ch,(void *)0x0,victim,2);
    pcVar14 = "$N staggers and looks stunned as the flail crashes into $S head!";
    break;
  case 9:
    act("$N staggers and looks stunned as your staff crashes into $S head!",ch,(void *)0x0,victim,3)
    ;
    act("You stagger in a daze as $n\'s staff crashes into your head!",ch,(void *)0x0,victim,2);
    pcVar14 = "$N staggers and looks stunned as the staff crashes into $S head!";
  }
  act(pcVar14,ch,(void *)0x0,victim,1);
  LAG_CHAR(victim,0x18);
  iVar8 = 0x96;
switchD_0032da5d_caseD_2:
  bVar4 = is_npc(victim);
  if ((!bVar4) && ((ch->fighting == (CHAR_DATA *)0x0 || (victim->fighting == (CHAR_DATA *)0x0)))) {
    bVar4 = can_see(victim,ch);
    if (bVar4) {
      pcVar12 = pers(ch,victim);
      pcVar14 = buf;
      sprintf(pcVar14,"Help! %s is trying to crush my skull!",pcVar12);
    }
    else {
      pcVar14 = "Help! Someone is trying to crush my skull!";
    }
    do_myell(victim,pcVar14,ch);
  }
  one_hit_new(ch,victim,(int)gsn_overhead,true,false,0,iVar8,(char *)0x0);
LAB_0032dcd3:
  bVar4 = (double)iVar7 < (double)iVar5 * 0.7;
LAB_0032dcec:
  check_improve(ch,(int)gsn_overhead,bVar4,1);
  WAIT_STATE(ch,0x18);
  return;
}

Assistant:

void do_overhead(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	char buf[MAX_STRING_LENGTH];
	int skill;
	float special;
	int dammod = 100;
	CHAR_DATA *victim;
	OBJ_DATA *weapon;
	AFFECT_DATA af;

	one_argument(argument, arg);

	skill = get_skill(ch, gsn_overhead);

	if (skill == 0)
	{
		send_to_char("Huh?\n\r", ch);
		return;
	}

	if (argument[0] == '\0')
	{
		victim = ch->fighting;
		if (victim == nullptr)
		{
			send_to_char("Overhead who?\n\r", ch);
			return;
		}
	}
	else
	{
		victim = get_char_room(ch, argument);

		if (victim == nullptr)
		{
			send_to_char("They aren't here.\n\r", ch);
			return;
		}
	}

	if (victim == ch)
	{
		send_to_char("You aren't too bright, are you?\n\r", ch);
		return;
	}

	weapon = get_eq_char(ch, WEAR_WIELD);

	if (!weapon)
	{
		send_to_char("You need to be wielding a weapon for that maneuver!\n\r", ch);
		return;
	}
	
	if (weapon->weight < 15)
	{
		send_to_char("Your weapon is too light for you to execute that maneuver.\n\r", ch);
		return;
	}

	if (is_safe(ch, victim))
		return;

	if (victim->size > ch->size + 1)
	{
		send_to_char("They are too large for you to properly perform an overhead strike.\n\r", ch);
		return;
	}

	if (ch->fighting == nullptr && is_affected(victim, gsn_overhead))
	{
		send_to_char("They are guarding their head too well right now.\n\r", ch);
		return;
	}

	switch (weapon->value[0])
	{
		case WEAPON_MACE:
			act("You swing your mace overhead and bring it down toward $N with terrible force!", ch, 0, victim, TO_CHAR);
			act("$n swings $s mace overhead and brings it down toward you with terrible force!", ch, 0, victim, TO_VICT);
			act("$n swings $s mace overhead and brings it down toward $N with terrible force!", ch, 0, victim, TO_NOTVICT);
			break;
		case WEAPON_STAFF:
			act("You let loose a vicious longarm strike, your staff arcing toward $N's head!", ch, 0, victim, TO_CHAR);
			act("$n lets loose a vicious longarm strike, $s staff arcing toward your head!", ch, 0, victim, TO_VICT);
			act("$n lets loose a vicious longarm strike, $s staff arcing towards $N's head!", ch, 0, victim, TO_NOTVICT);
			break;
		case WEAPON_FLAIL:
			act("The head of your flail whistles through the air, arcing towards $N's head!", ch, 0, victim, TO_CHAR);
			act("The head of $n's flail whistles through the air, arcing towards your head!", ch, 0, victim, TO_VICT);
			act("The head of $n's flail whistles through the air, arcing towards $N's head!", ch, 0, victim, TO_NOTVICT);
			break;
		case WEAPON_AXE:
			act("With a surge of brute force, you bring your axe arcing down towards $N's head!", ch, 0, victim, TO_CHAR);
			act("With a surge of brute force, $n brings $s axe arcing down towards your head!", ch, 0, victim, TO_VICT);
			act("With a surge of brute force, $n brings $s axe arcing down towards $N's head!", ch, 0, victim, TO_NOTVICT);
			break;
		case WEAPON_SWORD:
			act("You raise your sword and attempt a vicious overhead slice at $N!", ch, 0, victim, TO_CHAR);
			act("$n raises $s sword and attempts a vicious overhead slice at you!", ch, 0, victim, TO_VICT);
			act("$n raises $s sword and attempts a vicious overhead slice at $N!", ch, 0, victim, TO_NOTVICT);
			break;
		default:
			send_to_char("You cannot perform an overhead strike with that weapon.\n\r", ch);
			return;
	}

	special = (float)(skill * (1.00f + (ch->size - victim->size) / 4.00f) * (1.00f + weapon->weight / 200.00f));

	if (number_percent() < .7 * skill)
	{
		if (ch->fighting == nullptr)
		{
			if (number_percent() < .3 * special)
			{
				init_affect(&af);
				af.where = TO_AFFECTS;
				af.duration = 2;

				SET_BIT(af.bitvector, AFF_SLEEP);

				af.type = gsn_overhead;
				af.level = ch->level;
				af.aftype = AFT_MALADY;
				af.location = 0;
				af.modifier = 0;
				af.mod_name = MOD_CONC;

				switch (weapon->value[0])
				{
					case WEAPON_MACE:
						act("$N collapses in a heap as your mace comes down solidly on top of $S head!", ch, 0, victim, TO_CHAR);
						act("The world goes black as $n's mace crashes into your head.", ch, 0, victim, TO_VICT);
						act("$N collapses in a heap as the mace comes down solidly on top of $S head!", ch, 0, victim, TO_NOTVICT);

						affect_to_char(victim, &af);
						stop_fighting(victim, true);

						victim->position = POS_SLEEPING;

						check_improve(ch, gsn_overhead, true, 1);
						WAIT_STATE(ch, 2 * PULSE_VIOLENCE);
						return;
					case WEAPON_STAFF:
						act("$N collapses in a heap as your staff comes down solidly on top of $S head!", ch, 0, victim, TO_CHAR);
						act("The world goes black as $n's staff crashes into your head.", ch, 0, victim, TO_VICT);
						act("$N collapses in a heap as the staff comes down solidly on top of $S head!", ch, 0, victim, TO_NOTVICT);

						affect_to_char(victim, &af);
						stop_fighting(victim, true);

						victim->position = POS_SLEEPING;

						check_improve(ch, gsn_overhead, true, 1);
						WAIT_STATE(ch, 2 * PULSE_VIOLENCE);
						return;
					case WEAPON_FLAIL:
						act("$N collapses in a heap as your flail comes down solidly on top of $S head!", ch, 0, victim, TO_CHAR);
						act("The world goes black as $n's flail crashes into your head.", ch, 0, victim, TO_VICT);
						act("$N collapses in a heap as the flail comes down solidly on top of $S head!", ch, 0, victim, TO_NOTVICT);

						affect_to_char(victim, &af);
						stop_fighting(victim, true);

						victim->position = POS_SLEEPING;

						check_improve(ch, gsn_overhead, true, 1);
						WAIT_STATE(ch, 2 * PULSE_VIOLENCE);
						return;
				}
			}
		}

		if (number_percent() < .5 * special)
		{
			init_affect(&af);
			af.where = TO_AFFECTS;
			af.type = gsn_bleeding;
			af.location = APPLY_NONE;
			af.modifier = 0;
			af.aftype = AFT_INVIS;
			af.tick_fun = bleeding_tick;
			af.end_fun = nullptr;
			af.owner = ch;
			af.level = ch->level;

			switch (weapon->value[0])
			{
				case WEAPON_MACE:
					act("$N staggers and looks stunned as your mace crashes into $S head!", ch, 0, victim, TO_CHAR);
					act("You stagger in a daze as $n's mace crashes into your head!", ch, 0, victim, TO_VICT);
					act("$N staggers and looks stunned as the mace crashes into $S head!", ch, 0, victim, TO_NOTVICT);

					LAG_CHAR(victim, 2 * PULSE_VIOLENCE);
					dammod = 150;
					break;
				case WEAPON_STAFF:
					act("$N staggers and looks stunned as your staff crashes into $S head!", ch, 0, victim, TO_CHAR);
					act("You stagger in a daze as $n's staff crashes into your head!", ch, 0, victim, TO_VICT);
					act("$N staggers and looks stunned as the staff crashes into $S head!", ch, 0, victim, TO_NOTVICT);

					LAG_CHAR(victim, 2 * PULSE_VIOLENCE);
					dammod = 150;
					break;
				case WEAPON_FLAIL:
					act("$N staggers and looks stunned as your flail crashes into $S head!", ch, 0, victim, TO_CHAR);
					act("You stagger in a daze as $n's flail crashes into your head!", ch, 0, victim, TO_VICT);
					act("$N staggers and looks stunned as the flail crashes into $S head!", ch, 0, victim, TO_NOTVICT);

					LAG_CHAR(victim, 2 * PULSE_VIOLENCE);
					dammod = 150;
					break;
				case WEAPON_AXE:
					act("$N is enshrouded in a fine mist of blood as your mighty blow strikes true!", ch, 0, victim, TO_CHAR);
					act("You are enshrouded in a fine mist of blood as $n's axe strikes true!", ch, 0, victim, TO_VICT);
					act("$N is enshrouded in a fine mist of blood as the mighty blow strikes true!", ch, 0, victim, TO_NOTVICT);

					af.duration = ch->level / 8;

					/* fixed by cal 05/01/02 */
					if (!is_affected(victim, gsn_bleeding))
						new_affect_to_char(victim, &af);

					break;
				case WEAPON_SWORD:
					act("Your massive blade cleaves deeply into $N's flesh, striking bone!", ch, 0, victim, TO_CHAR);
					act("$n's massive blade cleaves deeply into your flesh, striking bone!", ch, 0, victim, TO_VICT);
					act("The massive blade cleaves deeply into $N's flesh, striking bone!", ch, 0, victim, TO_NOTVICT);

					dammod = 200;
					af.duration = ch->level / 12;

					if (!is_affected(victim, gsn_bleeding))
						new_affect_to_char(victim, &af);

					break;
			}
		}

		if (!is_npc(victim) && (ch->fighting == nullptr || victim->fighting == nullptr))
		{
			if (!can_see(victim, ch))
			{
				do_myell(victim, "Help! Someone is trying to crush my skull!", ch);
			}
			else
			{
				sprintf(buf, "Help! %s is trying to crush my skull!", pers(ch, victim));
				do_myell(victim, buf, ch);
			}
		}

		one_hit_new(ch, victim, gsn_overhead, HIT_SPECIALS, HIT_UNBLOCKABLE, HIT_NOADD, dammod, nullptr);
		check_improve(ch, gsn_overhead, true, 1);
	}
	else
	{
		damage(ch, victim, 0, gsn_overhead, DAM_NONE, true);
		check_improve(ch, gsn_overhead, false, 1);
	}

	WAIT_STATE(ch, PULSE_VIOLENCE * 2);
}